

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O2

int secp256k1_jacobi64_maybe_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  int alen;
  ulong uVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  long local_e0;
  int local_d0;
  uint local_cc;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_trans2x2 t;
  
  f.v[4] = (modinfo->modulus).v[4];
  f.v[0] = (modinfo->modulus).v[0];
  f.v[1] = (modinfo->modulus).v[1];
  f.v[2] = (modinfo->modulus).v[2];
  f.v[3] = (modinfo->modulus).v[3];
  g.v[0] = x->v[0];
  g.v[1] = x->v[1];
  g.v[2] = x->v[2];
  g.v[3] = x->v[3];
  g.v[4] = x->v[4];
  if ((((g.v[0] < 0) || (g.v[1] < 0)) || (g.v[2] < 0)) || ((g.v[3] < 0 || (g.v[4] < 0)))) {
    pcVar13 = 
    "test condition failed: g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0"
    ;
    uVar7 = 0x2dc;
  }
  else if (((g.v[2] == 0 && g.v[3] == 0) && (g.v[1] == 0 && g.v[0] == 0)) && g.v[4] == 0) {
    pcVar13 = "test condition failed: (g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4]) != 0";
    uVar7 = 0x2e1;
  }
  else {
    lVar11 = -1;
    alen = 5;
    uVar18 = 0;
    local_d0 = 0;
    while( true ) {
      lVar20 = 1;
      if (local_d0 == 0xc) {
        return 0;
      }
      uVar12 = f.v[1] << 0x3e | f.v[0];
      uVar14 = g.v[1] << 0x3e | g.v[0];
      lVar3 = 0;
      lVar9 = 0;
      iVar16 = 0x3e;
      uVar6 = uVar12;
      uVar22 = uVar14;
      local_e0 = lVar20;
      while( true ) {
        local_cc = uVar18;
        uVar1 = secp256k1_ctz64_var(-1L << ((byte)iVar16 & 0x3f) | uVar22);
        lVar11 = lVar11 - (ulong)uVar1;
        bVar4 = (byte)uVar1;
        uVar22 = uVar22 >> (bVar4 & 0x3f);
        lVar17 = local_e0 << (bVar4 & 0x3f);
        lVar15 = lVar3 << (bVar4 & 0x3f);
        uVar18 = ((uint)(uVar6 >> 1) ^ (uint)(uVar6 >> 2)) & uVar1 ^ local_cc;
        iVar16 = iVar16 - uVar1;
        if (iVar16 == 0) break;
        if ((uVar6 & 1) == 0) {
          pcVar13 = "test condition failed: (f & 1) == 1";
          uVar7 = 0x15b;
          goto LAB_001319d7;
        }
        if ((uVar22 & 1) == 0) {
          pcVar13 = "test condition failed: (g & 1) == 1";
          uVar7 = 0x15c;
          goto LAB_001319d7;
        }
        bVar4 = 0x3e - (char)iVar16;
        if (lVar15 * uVar14 + lVar17 * uVar12 != uVar6 << (bVar4 & 0x3f)) {
          pcVar13 = "test condition failed: (u * f0 + v * g0) == f << (62 - i)";
          uVar7 = 0x15d;
          goto LAB_001319d7;
        }
        if (lVar20 * uVar14 + lVar9 * uVar12 != uVar22 << (bVar4 & 0x3f)) {
          pcVar13 = "test condition failed: (q * f0 + r * g0) == g << (62 - i)";
          uVar7 = 0x15e;
          goto LAB_001319d7;
        }
        iVar10 = (int)uVar6;
        iVar21 = (int)uVar22;
        if (lVar11 < 0) {
          lVar11 = -lVar11;
          iVar5 = (int)lVar11 + 1;
          if (iVar16 <= iVar5) {
            iVar5 = iVar16;
          }
          if (iVar5 - 0x3fU < 0xffffffc2) {
            pcVar13 = "test condition failed: limit > 0 && limit <= 62";
            uVar7 = 0x16d;
            goto LAB_001319d7;
          }
          uVar18 = uVar18 ^ (uint)((uVar22 & uVar6) >> 1);
          uVar2 = (ulong)(0x3fL << (-(char)iVar5 & 0x3fU)) >> (-(char)iVar5 & 0x3fU);
          uVar1 = (iVar21 * iVar21 + 0x3e) * iVar21 * iVar10 & (uint)uVar2;
          lVar3 = lVar20;
          uVar8 = uVar22;
          local_e0 = lVar9;
        }
        else {
          iVar5 = (int)lVar11 + 1;
          if (iVar16 <= iVar5) {
            iVar5 = iVar16;
          }
          if (iVar5 - 0x3fU < 0xffffffc2) {
            pcVar13 = "test condition failed: limit > 0 && limit <= 62";
            uVar7 = 0x177;
            goto LAB_001319d7;
          }
          uVar2 = (ulong)(0xfL << (-(char)iVar5 & 0x3fU)) >> (-(char)iVar5 & 0x3fU);
          uVar1 = -(iVar21 * ((iVar10 * 2 + 2U & 8) + iVar10)) & (uint)uVar2;
          lVar3 = lVar15;
          uVar8 = uVar6;
          local_e0 = lVar17;
          uVar6 = uVar22;
          lVar17 = lVar9;
          lVar15 = lVar20;
        }
        uVar19 = (ulong)uVar1;
        uVar22 = uVar19 * uVar8 + uVar6;
        lVar9 = local_e0 * uVar19 + lVar17;
        lVar20 = uVar19 * lVar3 + lVar15;
        uVar6 = uVar8;
        if ((uVar22 & uVar2) != 0) {
          pcVar13 = "test condition failed: (g & m) == 0";
          uVar7 = 0x182;
          goto LAB_001319d7;
        }
      }
      t.u = lVar17;
      t.v = lVar15;
      t.q = lVar9;
      t.r = lVar20;
      iVar16 = secp256k1_modinv64_det_check_pow2(&t,0x3e,1);
      if (iVar16 == 0) break;
      iVar16 = secp256k1_modinv64_mul_cmp_62(&f,alen,&modinfo->modulus,0);
      if (iVar16 < 1) {
        pcVar13 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0";
        uVar7 = 0x2e8;
        goto LAB_001319d7;
      }
      lVar20 = 1;
      iVar16 = secp256k1_modinv64_mul_cmp_62(&f,alen,&modinfo->modulus,1);
      if (0 < iVar16) {
        pcVar13 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0";
        uVar7 = 0x2e9;
        goto LAB_001319d7;
      }
      iVar16 = secp256k1_modinv64_mul_cmp_62(&g,alen,&modinfo->modulus,0);
      if (iVar16 < 1) {
        pcVar13 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0";
        uVar7 = 0x2ea;
        goto LAB_001319d7;
      }
      iVar16 = secp256k1_modinv64_mul_cmp_62(&g,alen,&modinfo->modulus,1);
      if (-1 < iVar16) {
        pcVar13 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0";
        uVar7 = 0x2eb;
        goto LAB_001319d7;
      }
      secp256k1_modinv64_update_fg_62_var(alen,&f,&g,&t);
      lVar3 = (long)alen;
      if (f.v[0] == 1) {
        uVar6 = 0;
        for (; lVar20 < lVar3; lVar20 = lVar20 + 1) {
          uVar6 = uVar6 | f.v[lVar20];
        }
        if (uVar6 == 0) {
          return 1 - (uVar18 * 2 & 2);
        }
      }
      if ((-1 < lVar3 + -2 && f.v[lVar3 + -1] == 0) && *(long *)(&local_d0 + lVar3 * 2) == 0) {
        alen = alen + -1;
      }
      iVar16 = secp256k1_modinv64_mul_cmp_62(&f,alen,&modinfo->modulus,0);
      if (iVar16 < 1) {
        pcVar13 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0";
        uVar7 = 0x302;
        goto LAB_001319d7;
      }
      iVar16 = secp256k1_modinv64_mul_cmp_62(&f,alen,&modinfo->modulus,1);
      if (0 < iVar16) {
        pcVar13 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0";
        uVar7 = 0x303;
        goto LAB_001319d7;
      }
      iVar16 = secp256k1_modinv64_mul_cmp_62(&g,alen,&modinfo->modulus,0);
      if (iVar16 < 1) {
        pcVar13 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0";
        uVar7 = 0x304;
        goto LAB_001319d7;
      }
      iVar16 = secp256k1_modinv64_mul_cmp_62(&g,alen,&modinfo->modulus,1);
      if (-1 < iVar16) {
        pcVar13 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0";
        uVar7 = 0x305;
        goto LAB_001319d7;
      }
      local_d0 = local_d0 + 1;
    }
    pcVar13 = "test condition failed: secp256k1_modinv64_det_check_pow2(t, 62, 1)";
    uVar7 = 0x18e;
  }
LAB_001319d7:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
          ,uVar7,pcVar13);
  abort();
}

Assistant:

static int secp256k1_jacobi64_maybe_var(const secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4]) != 0);

    for (count = 0; count < JACOBI64_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 62 posdivsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_posdivsteps_62_var(eta, f.v[0] | ((uint64_t)f.v[1] << 62), g.v[0] | ((uint64_t)g.v[1] << 62), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. When f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1550 iterations. Return 0, indicating unknown result. */
    return 0;
}